

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test39(void)

{
  CMReturn In;
  CMReturn In_00;
  CMReturn In_01;
  CMReturn In_02;
  CMOptions Options;
  undefined1 auVar1 [24];
  CMOptions Options_00;
  CMOptions Options_01;
  CMOptions Options_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2420;
  allocator<char> local_2399;
  string local_2398;
  allocator<char> local_2371;
  string local_2370;
  CMReturn local_2350;
  uint64_t local_2338;
  uint64_t uStack_2330;
  uint64_t local_2328;
  pointer local_2318;
  undefined8 uStack_2310;
  undefined8 local_2308;
  undefined8 uStack_2300;
  undefined8 local_22f8;
  undefined8 uStack_22f0;
  allocator<char> local_22d9;
  string local_22d8;
  allocator<char> local_22b1;
  string local_22b0;
  CMReturn local_2290;
  uint64_t local_2278;
  uint64_t uStack_2270;
  uint64_t local_2268;
  pointer local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  allocator<char> local_2219;
  string local_2218;
  allocator<char> local_21f1;
  string local_21f0;
  CMReturn local_21d0;
  uint64_t local_21b8;
  uint64_t uStack_21b0;
  uint64_t local_21a8;
  pointer local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  allocator<char> local_2161;
  string local_2160;
  allocator<char> local_2139;
  string local_2138;
  undefined1 auStack_2118 [8];
  CMReturn res;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20f5;
  key_equal local_20f4;
  hasher local_20f3;
  undefined1 local_20f2;
  allocator<char> local_20f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20e8;
  iterator local_20c8;
  size_type local_20c0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2070;
  undefined1 local_2058 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  undefined1 local_20 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2070,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_20f2 = 1;
  local_20f0 = &local_20e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20e8,"f",&local_20f1);
  local_20f2 = 0;
  local_20c8 = &local_20e8;
  local_20c0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_20f5);
  __l._M_len = local_20c0;
  __l._M_array = local_20c8;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_20b8,__l,0,&local_20f3,&local_20f4,&local_20f5);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_2058,&local_2070,&local_20b8,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_20b8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_20f5);
  local_2420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20c8;
  do {
    local_2420 = local_2420 + -1;
    std::__cxx11::string::~string((string *)local_2420);
  } while (local_2420 != &local_20e8);
  std::allocator<char>::~allocator(&local_20f1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2070);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2138,"AABC",&local_2139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2160,"ABC",&local_2161);
  local_2178 = 1;
  uStack_2170 = 0;
  local_2188 = 0;
  uStack_2180 = 1000000;
  local_2198 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2190 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options.TimeoutNs = 1000000;
  Options.MatchRepeating = (bool)auVar1[0];
  Options._1_7_ = auVar1._1_7_;
  Options.StartIndex = auVar1._8_8_;
  Options.StartFromEnd = (bool)auVar1[0x10];
  Options._17_7_ = auVar1._17_7_;
  Options._32_8_ = 1;
  Options.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)auStack_2118,(ConfusableMatcher *)local_2058,&local_2138,&local_2160,
             Options);
  std::__cxx11::string::~string((string *)&local_2160);
  std::allocator<char>::~allocator(&local_2161);
  std::__cxx11::string::~string((string *)&local_2138);
  std::allocator<char>::~allocator(&local_2139);
  local_21a8 = res.Size;
  local_21b8 = (uint64_t)auStack_2118;
  uStack_21b0 = res.Start;
  In.Size = res.Start;
  In.Start = (uint64_t)auStack_2118;
  In._16_8_ = res.Size;
  AssertMatch(In,0,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21f0,"AfABC",&local_21f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2218,"ABC",&local_2219);
  local_2238 = 1;
  uStack_2230 = 0;
  local_2248 = 0;
  uStack_2240 = 1000000;
  local_2258 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2250 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_00.TimeoutNs = 1000000;
  Options_00.MatchRepeating = (bool)auVar1[0];
  Options_00._1_7_ = auVar1._1_7_;
  Options_00.StartIndex = auVar1._8_8_;
  Options_00.StartFromEnd = (bool)auVar1[0x10];
  Options_00._17_7_ = auVar1._17_7_;
  Options_00._32_8_ = 1;
  Options_00.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_21d0,(ConfusableMatcher *)local_2058,&local_21f0,&local_2218,Options_00);
  res.Size = local_21d0._16_8_;
  auStack_2118 = (undefined1  [8])local_21d0.Start;
  res.Start = local_21d0.Size;
  std::__cxx11::string::~string((string *)&local_2218);
  std::allocator<char>::~allocator(&local_2219);
  std::__cxx11::string::~string((string *)&local_21f0);
  std::allocator<char>::~allocator(&local_21f1);
  local_2268 = res.Size;
  local_2278 = (uint64_t)auStack_2118;
  uStack_2270 = res.Start;
  In_00.Size = res.Start;
  In_00.Start = (uint64_t)auStack_2118;
  In_00._16_8_ = res.Size;
  AssertMatch(In_00,0,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22b0,"ABCC",&local_22b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22d8,"ABC",&local_22d9);
  local_22f8 = 1;
  uStack_22f0 = 0;
  local_2308 = 0;
  uStack_2300 = 1000000;
  local_2318 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2310 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_01.TimeoutNs = 1000000;
  Options_01.MatchRepeating = (bool)auVar1[0];
  Options_01._1_7_ = auVar1._1_7_;
  Options_01.StartIndex = auVar1._8_8_;
  Options_01.StartFromEnd = (bool)auVar1[0x10];
  Options_01._17_7_ = auVar1._17_7_;
  Options_01._32_8_ = 1;
  Options_01.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_2290,(ConfusableMatcher *)local_2058,&local_22b0,&local_22d8,Options_01);
  res.Size = local_2290._16_8_;
  auStack_2118 = (undefined1  [8])local_2290.Start;
  res.Start = local_2290.Size;
  std::__cxx11::string::~string((string *)&local_22d8);
  std::allocator<char>::~allocator(&local_22d9);
  std::__cxx11::string::~string((string *)&local_22b0);
  std::allocator<char>::~allocator(&local_22b1);
  local_2328 = res.Size;
  local_2338 = (uint64_t)auStack_2118;
  uStack_2330 = res.Start;
  In_01.Size = res.Start;
  In_01.Start = (uint64_t)auStack_2118;
  In_01._16_8_ = res.Size;
  AssertMatch(In_01,0,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2370,"ABCfC",&local_2371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2398,"ABC",&local_2399);
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_02.TimeoutNs = 1000000;
  Options_02.MatchRepeating = (bool)auVar1[0];
  Options_02._1_7_ = auVar1._1_7_;
  Options_02.StartIndex = auVar1._8_8_;
  Options_02.StartFromEnd = (bool)auVar1[0x10];
  Options_02._17_7_ = auVar1._17_7_;
  Options_02._32_8_ = 1;
  Options_02.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_2350,(ConfusableMatcher *)local_2058,&local_2370,&local_2398,Options_02);
  res.Size = local_2350._16_8_;
  auStack_2118 = (undefined1  [8])local_2350.Start;
  res.Start = local_2350.Size;
  std::__cxx11::string::~string((string *)&local_2398);
  std::allocator<char>::~allocator(&local_2399);
  std::__cxx11::string::~string((string *)&local_2370);
  std::allocator<char>::~allocator(&local_2371);
  In_02.Size = res.Start;
  In_02.Start = (uint64_t)auStack_2118;
  In_02._16_8_ = res.Size;
  AssertMatch(In_02,0,5);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_2058);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_20);
  return;
}

Assistant:

void Test39()
{
	std::vector<std::pair<std::string, std::string>> map;

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchOnWordBoundary = true;
	opts.MatchRepeating = true;

	auto matcher = ConfusableMatcher(map, { "f" });
	auto res = matcher.IndexOf("AABC", "ABC", opts);
	AssertMatch(res, 0, 4);

	res = matcher.IndexOf("AfABC", "ABC", opts);
	AssertMatch(res, 0, 5);

	res = matcher.IndexOf("ABCC", "ABC", opts);
	AssertMatch(res, 0, 4);

	res = matcher.IndexOf("ABCfC", "ABC", opts);
	AssertMatch(res, 0, 5);
}